

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::password(Config *this,string *parameter)

{
  __shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  QUtil::make_shared_cstr((QUtil *)&local_20,parameter);
  std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::password(std::string const& parameter)
{
    o.m->password = QUtil::make_shared_cstr(parameter);
    return this;
}